

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O2

void __thiscall
duckdb::CompressedMaterialization::CreateDecompressProjection
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op,CompressedMaterializationInfo *info)

{
  optional_ptr<duckdb::LogicalOperator,_true> *this_00;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var2;
  undefined8 uVar3;
  pointer pLVar4;
  const_reference pvVar5;
  const_reference args;
  pointer pLVar6;
  reference this_01;
  type pLVar7;
  LogicalOperator *pLVar8;
  reference __args_1;
  reference __args_2;
  reference pvVar9;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *this_02;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  idx_t table_index;
  vector<duckdb::ColumnBinding,_true> bindings;
  ColumnBindingReplacer replacer;
  vector<duckdb::ColumnBinding,_true> new_bindings;
  vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> statistics;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  decompress_exprs;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_f0;
  CompressedMaterialization *local_e8;
  undefined1 local_e0 [24];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  optional_ptr<duckdb::LogicalOperator,_true> local_88;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_80;
  _Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
  local_68;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_48;
  
  local_e8 = this;
  local_e0._16_8_ = info;
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  (*pLVar4->_vptr_LogicalOperator[2])(local_c8 + 8,pLVar4);
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  LogicalOperator::ResolveOperatorTypes(pLVar4);
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0._16_8_ = local_e0._16_8_ + 0x10;
  for (uVar10 = 0; uVar10 < (ulong)((long)(local_b8._0_8_ - local_c8._8_8_) >> 4);
      uVar10 = uVar10 + 1) {
    pvVar5 = vector<duckdb::ColumnBinding,_true>::get<true>
                       ((vector<duckdb::ColumnBinding,_true> *)(local_c8 + 8),uVar10);
    args = vector<duckdb::LogicalType,_true>::get<true>(&pLVar4->types,uVar10);
    make_uniq_base<duckdb::Expression,duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
              ((duckdb *)local_a8,args,pvVar5);
    local_80._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._16_8_;
    while (p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11->_vptr__Sp_counted_base
          , p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (((*(idx_t *)&p_Var11[1]._M_use_count == pvVar5->table_index) &&
          ((_Hash_node_base *)p_Var11[2]._vptr__Sp_counted_base ==
           (_Hash_node_base *)pvVar5->column_index)) &&
         (local_80._M_impl.super__Vector_impl_data._M_start = *(pointer *)&p_Var11[4]._M_use_count,
         *(char *)&p_Var11[4]._vptr__Sp_counted_base == '\x01')) {
        local_e0._8_8_ = local_a8._0_8_;
        local_a8._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
        optional_ptr<duckdb::BaseStatistics,_true>::operator*
                  ((optional_ptr<duckdb::BaseStatistics,_true> *)&local_80);
        GetDecompressExpression
                  ((CompressedMaterialization *)local_c8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_e8,(LogicalType *)(local_e0 + 8),(BaseStatistics *)&p_Var11[2]._M_use_count
                  );
        uVar3 = local_a8._0_8_;
        local_a8._0_8_ = local_c8._0_8_;
        if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)uVar3 !=
            (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
          (**(code **)(*(_func_int **)uVar3 + 8))();
        }
        if ((Optimizer *)local_e0._8_8_ != (Optimizer *)0x0) {
          (*(code *)((*(ClientContext **)local_e0._8_8_)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
        local_e0._8_8_ = (element_type *)0x0;
      }
    }
    ::std::
    vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
    ::push_back((vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
                 *)&local_68,(value_type *)&local_80);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_48,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_a8);
    if ((Expression *)local_a8._0_8_ != (Expression *)0x0) {
      (**(code **)(*(_func_int **)local_a8._0_8_ + 8))();
    }
  }
  local_c8._0_8_ = Binder::GenerateTableIndex(local_e8->optimizer->binder);
  make_uniq<duckdb::LogicalProjection,unsigned_long_const&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            ((duckdb *)&local_f0,(unsigned_long *)local_c8,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_48);
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  if (pLVar4->has_estimated_cardinality == true) {
    pLVar6 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
             ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                           *)&local_f0);
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    LogicalOperator::SetEstimatedCardinality
              (&pLVar6->super_LogicalOperator,pLVar4->estimated_cardinality);
  }
  pLVar6 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
           ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                         *)&local_f0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)&(pLVar6->super_LogicalOperator).children,op);
  _Var2._M_head_impl = local_f0._M_head_impl;
  local_f0._M_head_impl = (LogicalProjection *)0x0;
  _Var1._M_head_impl =
       (op->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (op->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       &(_Var2._M_head_impl)->super_LogicalOperator;
  if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar4->children,0);
  pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(this_01);
  this_00 = &local_e8->root;
  pLVar8 = optional_ptr<duckdb::LogicalOperator,_true>::operator*(this_00);
  if (pLVar7 == pLVar8) {
    this_00->ptr = (op->
                   super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  }
  else {
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    (*pLVar4->_vptr_LogicalOperator[2])(&local_80,pLVar4);
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    LogicalOperator::ResolveOperatorTypes(pLVar4);
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    ColumnBindingReplacer::ColumnBindingReplacer((ColumnBindingReplacer *)local_a8);
    for (uVar10 = 0; uVar10 < (ulong)((long)(local_b8._0_8_ - local_c8._8_8_) >> 4);
        uVar10 = uVar10 + 1) {
      pvVar5 = vector<duckdb::ColumnBinding,_true>::get<true>
                         ((vector<duckdb::ColumnBinding,_true> *)(local_c8 + 8),uVar10);
      __args_1 = vector<duckdb::ColumnBinding,_true>::get<true>
                           ((vector<duckdb::ColumnBinding,_true> *)&local_80,uVar10);
      __args_2 = vector<duckdb::LogicalType,_true>::get<true>(&pLVar4->types,uVar10);
      ::std::vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>>::
      emplace_back<duckdb::ColumnBinding_const&,duckdb::ColumnBinding_const&,duckdb::LogicalType_const&>
                ((vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>> *)
                 (local_a8 + 8),pvVar5,__args_1,__args_2);
      pvVar9 = vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true>::get<true>
                         ((vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> *)
                          &local_68,uVar10);
      if (pvVar9->ptr != (BaseStatistics *)0x0) {
        pvVar9 = vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true>::get<true>
                           ((vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> *)
                            &local_68,uVar10);
        optional_ptr<duckdb::BaseStatistics,_true>::operator->(pvVar9);
        BaseStatistics::ToUnique((BaseStatistics *)local_e0);
        this_02 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   *)::std::__detail::
                     _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)local_e8->statistics_map,__args_1);
        uVar3 = local_e0._0_8_;
        local_e0._0_8_ = (BaseStatistics *)0x0;
        ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
        ::reset(this_02,(pointer)uVar3);
        ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
        ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                     *)local_e0);
      }
    }
    local_88.ptr = (op->
                   super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    pLVar8 = optional_ptr<duckdb::LogicalOperator,_true>::operator*(this_00);
    ColumnBindingReplacer::VisitOperator((ColumnBindingReplacer *)local_a8,pLVar8);
    ColumnBindingReplacer::~ColumnBindingReplacer((ColumnBindingReplacer *)local_a8);
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base(&local_80);
  }
  if (local_f0._M_head_impl != (LogicalProjection *)0x0) {
    (*((local_f0._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
  }
  ::std::
  _Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
  ::~_Vector_base(&local_68);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_48);
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             (local_c8 + 8));
  return;
}

Assistant:

void CompressedMaterialization::CreateDecompressProjection(unique_ptr<LogicalOperator> &op,
                                                           CompressedMaterializationInfo &info) {
	const auto bindings = op->GetColumnBindings();
	op->ResolveOperatorTypes();
	const auto &types = op->types;

	// Create decompress expressions for everything we compressed
	auto &binding_map = info.binding_map;
	vector<unique_ptr<Expression>> decompress_exprs;
	vector<optional_ptr<BaseStatistics>> statistics;
	for (idx_t col_idx = 0; col_idx < bindings.size(); col_idx++) {
		const auto &binding = bindings[col_idx];
		auto decompress_expr = make_uniq_base<Expression, BoundColumnRefExpression>(types[col_idx], binding);
		optional_ptr<BaseStatistics> stats;
		for (auto &entry : binding_map) {
			auto &binding_info = entry.second;
			if (binding_info.binding != binding) {
				continue;
			}
			stats = binding_info.stats.get();
			if (binding_info.needs_decompression) {
				decompress_expr = GetDecompressExpression(std::move(decompress_expr), binding_info.type, *stats);
			}
		}
		statistics.push_back(stats);
		decompress_exprs.emplace_back(std::move(decompress_expr));
	}

	// Replace op with a projection
	const auto table_index = optimizer.binder.GenerateTableIndex();
	auto decompress_projection = make_uniq<LogicalProjection>(table_index, std::move(decompress_exprs));
	if (op->has_estimated_cardinality) {
		decompress_projection->SetEstimatedCardinality(op->estimated_cardinality);
	}

	decompress_projection->children.emplace_back(std::move(op));
	op = std::move(decompress_projection);

	// Check if we're placing a projection on top of the root
	if (RefersToSameObject(*op->children[0], *root)) {
		root = op;
		return;
	}

	// Get the new bindings and types
	auto new_bindings = op->GetColumnBindings();
	op->ResolveOperatorTypes();
	auto &new_types = op->types;

	// Initialize a ColumnBindingReplacer with the new bindings and types
	ColumnBindingReplacer replacer;
	auto &replacement_bindings = replacer.replacement_bindings;
	for (idx_t col_idx = 0; col_idx < bindings.size(); col_idx++) {
		const auto &old_binding = bindings[col_idx];
		const auto &new_binding = new_bindings[col_idx];
		const auto &new_type = new_types[col_idx];
		replacement_bindings.emplace_back(old_binding, new_binding, new_type);

		if (statistics[col_idx]) {
			statistics_map[new_binding] = statistics[col_idx]->ToUnique();
		}
	}

	// Make sure we skip the decompress operator when replacing bindings
	replacer.stop_operator = op.get();

	// Make the plan consistent again
	replacer.VisitOperator(*root);
}